

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall
cfd::TransactionContext::TransactionContext(TransactionContext *this,Transaction *transaction)

{
  AbstractTransaction *in_RSI;
  Transaction *in_RDI;
  string local_30;
  
  core::AbstractTransaction::GetHex_abi_cxx11_(&local_30,in_RSI);
  core::Transaction::Transaction(in_RDI,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (in_RDI->super_AbstractTransaction)._vptr_AbstractTransaction =
       (_func_int **)&PTR__TransactionContext_009f7670;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x50bd13);
  std::
  map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
  ::map((map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
         *)0x50bd21);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)0x50bd32);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)0x50bd43);
  return;
}

Assistant:

TransactionContext::TransactionContext(const Transaction& transaction)
    : Transaction(transaction.GetHex()) {}